

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_aggregate_function.cpp
# Opt level: O2

void __thiscall
duckdb::WindowAggregateExecutor::Finalize
          (WindowAggregateExecutor *this,WindowExecutorGlobalState *gstate,
          WindowExecutorLocalState *lstate,CollectionPtr collection)

{
  long lVar1;
  const_reference pvVar2;
  pointer pWVar3;
  type pWVar4;
  type pWVar5;
  _Head_base<0UL,_duckdb::BaseStatistics_*,_false> _Var6;
  BoundWindowExpression *pBVar7;
  long lVar8;
  FrameDelta local_50;
  FrameDelta local_40;
  
  (*(lstate->super_WindowExecutorState)._vptr_WindowExecutorState[3])(lstate,gstate,collection.ptr);
  local_40.begin = 0;
  local_40.end = 0;
  lVar1 = NumericCastImpl<long,_unsigned_long,_false>::Convert(gstate->payload_count);
  lVar8 = -lVar1;
  pBVar7 = (this->super_WindowExecutor).wexpr;
  local_50.begin = lVar8;
  local_50.end = lVar1;
  if ((pBVar7->expr_stats).
      super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pBVar7->expr_stats).
      super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    _Var6._M_head_impl = (BaseStatistics *)0x0;
  }
  else {
    pvVar2 = vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
             ::get<true>(&pBVar7->expr_stats,0);
    _Var6._M_head_impl =
         (pvVar2->
         super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
         .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
    pBVar7 = (this->super_WindowExecutor).wexpr;
  }
  ApplyWindowStats(&pBVar7->start,&local_50,_Var6._M_head_impl,true);
  pBVar7 = (this->super_WindowExecutor).wexpr;
  local_40.begin = lVar8;
  local_40.end = lVar1;
  if ((pBVar7->expr_stats).
      super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (pBVar7->expr_stats).
      super_vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    _Var6._M_head_impl = (BaseStatistics *)0x0;
  }
  else {
    pvVar2 = vector<duckdb::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>,_true>
             ::get<true>(&pBVar7->expr_stats,1);
    _Var6._M_head_impl =
         (pvVar2->
         super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>).
         _M_t.
         super___uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::BaseStatistics_*,_std::default_delete<duckdb::BaseStatistics>_>
         .super__Head_base<0UL,_duckdb::BaseStatistics_*,_false>._M_head_impl;
    pBVar7 = (this->super_WindowExecutor).wexpr;
  }
  ApplyWindowStats(&pBVar7->end,&local_40,_Var6._M_head_impl,false);
  pWVar3 = unique_ptr<duckdb::WindowAggregator,_std::default_delete<duckdb::WindowAggregator>,_true>
           ::operator->(&this->aggregator);
  pWVar4 = unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
           ::operator*((unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
                        *)(gstate + 1));
  pWVar5 = unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
           ::operator*((unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
                        *)&lstate[0x11].range_cursor);
  (*pWVar3->_vptr_WindowAggregator[5])(pWVar3,pWVar4,pWVar5,collection.ptr,&local_50);
  return;
}

Assistant:

void WindowAggregateExecutor::Finalize(WindowExecutorGlobalState &gstate, WindowExecutorLocalState &lstate,
                                       CollectionPtr collection) const {
	WindowExecutor::Finalize(gstate, lstate, collection);

	auto &gastate = gstate.Cast<WindowAggregateExecutorGlobalState>();
	auto &gsink = gastate.gsink;
	D_ASSERT(aggregator);

	//	Estimate the frame statistics
	//	Default to the entire partition if we don't know anything
	FrameStats stats;
	const auto count = NumericCast<int64_t>(gastate.payload_count);

	//	First entry is the frame start
	stats[0] = FrameDelta(-count, count);
	auto base = wexpr.expr_stats.empty() ? nullptr : wexpr.expr_stats[0].get();
	ApplyWindowStats(wexpr.start, stats[0], base, true);

	//	Second entry is the frame end
	stats[1] = FrameDelta(-count, count);
	base = wexpr.expr_stats.empty() ? nullptr : wexpr.expr_stats[1].get();
	ApplyWindowStats(wexpr.end, stats[1], base, false);

	auto &lastate = lstate.Cast<WindowAggregateExecutorLocalState>();
	aggregator->Finalize(*gsink, *lastate.aggregator_state, collection, stats);
}